

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_update_nonexist_single(planck_unit_test_t *tc)

{
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined1 local_78 [8];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  bhdct_setup(tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)local_78,
              ion_fill_none);
  local_7c = 10;
  local_80 = 4;
  bhdct_insert(tc,(ion_dictionary_t *)local_78,&local_7c,&local_80,'\x01');
  local_84 = 3;
  local_88 = 5;
  bhdct_update(tc,(ion_dictionary_t *)local_78,&local_84,&local_88,'\0',1,'\x01');
  bhdct_takedown(tc,(ion_dictionary_t *)local_78);
  return;
}

Assistant:

void
test_bhdct_update_nonexist_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(10, int), IONIZE(4, int), boolean_true);
	bhdct_update(tc, &dict, IONIZE(3, int), IONIZE(5, int), err_ok, 1, boolean_true);

	bhdct_takedown(tc, &dict);
}